

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

bool __thiscall cmFileLockPool::ScopePool::IsAlreadyLocked(ScopePool *this,string *filename)

{
  pointer ppcVar1;
  pointer ppcVar2;
  bool bVar3;
  pointer ppcVar4;
  
  ppcVar2 = (this->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    ppcVar4 = ppcVar2;
    ppcVar1 = (this->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppcVar4 == ppcVar1) break;
    bVar3 = cmFileLock::IsLocked(*ppcVar4,filename);
    ppcVar2 = ppcVar4 + 1;
  } while (!bVar3);
  return ppcVar4 != ppcVar1;
}

Assistant:

bool cmFileLockPool::ScopePool::IsAlreadyLocked(
  const std::string& filename) const
{
  for (CIt i = this->Locks.begin(); i != this->Locks.end(); ++i) {
    if ((*i)->IsLocked(filename)) {
      return true;
    }
  }
  return false;
}